

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_tests.cpp
# Opt level: O1

void __thiscall
syntax_tests::iu_PrintToTest_x_iutest_x_U16String_Test::Body
          (iu_PrintToTest_x_iutest_x_U16String_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  AssertionHelper local_1c8;
  undefined1 local_198 [392];
  
  memset((iuStreamMessage *)local_198,0,0x188);
  iutest::iu_global_format_stringstream::iu_global_format_stringstream
            ((iu_global_format_stringstream *)local_198);
  iutest::detail::iuStreamMessage::operator<<
            ((iuStreamMessage *)local_198,(char16_t (*) [5])L"test");
  paVar1 = &local_1c8.m_part_result.super_iuCodeMessage.m_message.field_2;
  local_1c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"Succeeded.\n","");
  local_1c8.m_part_result.super_iuCodeMessage.m_file =
       "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp";
  local_1c8.m_part_result.super_iuCodeMessage.m_line = 0x408;
  local_1c8.m_part_result.super_iuCodeMessage._44_4_ = 0;
  iutest::AssertionHelper::OnFixed(&local_1c8,(Fixed *)local_198,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_1c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                    local_1c8.m_part_result.super_iuCodeMessage.m_message.field_2.
                    _M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_198);
  std::ios_base::~ios_base((ios_base *)(local_198 + 0x80));
  return;
}

Assistant:

IUTEST(PrintToTest, U16String)
{
    IUTEST_SUCCEED() << u"test";
}